

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O2

void render(void)

{
  double cpuDt_00;
  double in_XMM1_Qa;
  double gpuDt;
  double cpuDt;
  double local_10;
  double local_8;
  
  djgc_start(g_gl.clocks[0]);
  renderScene();
  djgc_stop(g_gl.clocks[0]);
  djgc_ticks(g_gl.clocks[0],&local_8,&local_10);
  renderViewer(cpuDt_00,in_XMM1_Qa);
  renderBack();
  g_app.frame = g_app.frame + 1;
  return;
}

Assistant:

void render()
{
    double cpuDt, gpuDt;

    djgc_start(g_gl.clocks[CLOCK_SPF]);
    renderScene();
    djgc_stop(g_gl.clocks[CLOCK_SPF]);
    djgc_ticks(g_gl.clocks[CLOCK_SPF], &cpuDt, &gpuDt);
    renderViewer(cpuDt, gpuDt);
    renderBack();
    ++g_app.frame;
}